

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::featureSpecList(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  RefAST RVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  NoViableAltException *pNVar6;
  RefAST *this_01;
  RefAST tmp156_AST;
  RefAST featureSpecList_AST;
  ASTPair currentAST;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefToken local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  featureSpecList_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar4 == 0xd) {
LAB_0016ad82:
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar4 != 0xb) goto LAB_0016ae96;
    featureSpecStruct(this);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    local_38.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_38.ref != (Ref *)0x0) {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_38);
    RefCount<AST>::~RefCount(&local_38);
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 != 0xd) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar4 == 0x10) goto LAB_0016ae0b;
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar4 == 0x11) goto LAB_0016ae0b;
LAB_0016b14b:
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar3 = BitSet::member(&_tokenSet_42,iVar4);
      if (!bVar3) {
LAB_0016b23c:
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_48);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (!bVar3) goto LAB_0016b23c;
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (!bVar3) goto LAB_0016b23c;
      goto LAB_0016b1b1;
    }
LAB_0016ae0b:
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar4 != 4) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar4 != 0xb) {
        iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar4 != 0x12) goto LAB_0016b14b;
      }
    }
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar3 = BitSet::member(&_tokenSet_41,iVar4);
    if (!bVar3) goto LAB_0016b14b;
    featureSpecList(this);
    local_40.ref = this_00->ref;
    if (local_40.ref != (Ref *)0x0) {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_40);
    this_01 = &local_40;
  }
  else {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 == 0x10) goto LAB_0016ad82;
LAB_0016ae96:
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 != 0xd) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar4 != 0x10) {
        iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        if (iVar4 != 0x11) goto LAB_0016b285;
      }
    }
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar4 != 4) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar4 != 0x12) {
LAB_0016b285:
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_70);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
    }
    featureSpecFlat(this);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_50.ref != (Ref *)0x0) {
      (local_50.ref)->count = (local_50.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_50);
    RefCount<AST>::~RefCount(&local_50);
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 == 8) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar4 != 0xd) {
        iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar4 != 0x10) {
          iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
          if (iVar4 != 0x11) goto LAB_0016b04c;
        }
      }
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      if (iVar4 != 4) {
        iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
        if (iVar4 != 0xb) {
          iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
          if (iVar4 != 0x12) goto LAB_0016b04c;
        }
      }
      tmp156_AST.ref = nullAST.ref;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      ASTFactory::create((ASTFactory *)&stack0xffffffffffffff50,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp156_AST,(RefCount<AST> *)&stack0xffffffffffffff50);
      RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff50);
      RefCount<Token>::~RefCount(&local_78);
      Parser::match((Parser *)this,8);
      featureSpecList(this);
      local_58.ref = this_00->ref;
      if (local_58.ref != (Ref *)0x0) {
        (local_58.ref)->count = (local_58.ref)->count + 1;
      }
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_58);
      RefCount<AST>::~RefCount(&local_58);
      RefCount<AST>::~RefCount(&tmp156_AST);
    }
    else {
LAB_0016b04c:
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar3 = BitSet::member(&_tokenSet_43,iVar4);
      if (!bVar3) {
LAB_0016b1f3:
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_60);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (!bVar3) goto LAB_0016b1f3;
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (!bVar3) goto LAB_0016b1f3;
    }
    uVar5 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar2 = nullAST;
    if (0x11 < uVar5) {
LAB_0016b2cb:
      pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      NoViableAltException::NoViableAltException(pNVar6,&local_68);
      __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if ((0x3f600U >> (uVar5 & 0x1f) & 1) != 0) goto LAB_0016b1b1;
    if (uVar5 != 8) goto LAB_0016b2cb;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp156_AST = RVar2;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    ASTFactory::create((ASTFactory *)&stack0xffffffffffffff50,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp156_AST,(RefCount<AST> *)&stack0xffffffffffffff50);
    RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff50);
    RefCount<Token>::~RefCount(&local_80);
    Parser::match((Parser *)this,8);
    this_01 = &tmp156_AST;
  }
  RefCount<AST>::~RefCount(this_01);
LAB_0016b1b1:
  RefCount<AST>::operator=(&featureSpecList_AST,&currentAST.root);
  RefCount<AST>::operator=(this_00,&featureSpecList_AST);
  RefCount<AST>::~RefCount(&featureSpecList_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::featureSpecList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST featureSpecList_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT||LA(1)==LITERAL_name) && (LA(2)==OP_LBRACE)) {
			featureSpecStruct();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_LBRACE||LA(2)==OP_DOT) && (_tokenSet_41.member(LA(3)))) {
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_42.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
		}
		else if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_DOT)) {
			featureSpecFlat();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==OP_SEMI) && (LA(2)==IDENT||LA(2)==LITERAL_name||LA(2)==LIT_INT) && (LA(3)==OP_EQ||LA(3)==OP_LBRACE||LA(3)==OP_DOT)) {
				RefAST tmp156_AST = nullAST;
				tmp156_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_43.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp157_AST = nullAST;
				tmp157_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case LITERAL_environment:
			case LITERAL_endenvironment:
			case OP_RBRACE:
			case IDENT:
			case LITERAL_table:
			case LITERAL_endtable:
			case LITERAL_name:
			case LIT_INT:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		featureSpecList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_42);
	}
	returnAST = featureSpecList_AST;
}